

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1319::run(TestCase1319 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  uint64_t local_1b8;
  int local_1b0;
  bool local_1a9;
  uint64_t uStack_1a8;
  bool _kj_shouldLog;
  int local_1a0;
  DebugExpression<int> local_19c;
  undefined1 local_198 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_1;
  Fault f;
  undefined1 local_160 [7];
  DebugExpression<bool> _kjCondition;
  Builder root_1;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase1319 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestOldUnionVersion>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestOldUnionVersion::Builder::setB((Builder *)local_128,0x7b);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestNewUnionVersion>
            ((Builder *)local_160,(MessageBuilder *)&root._builder.dataSize);
  f.exception._6_1_ =
       capnproto_test::capnp::test::TestNewUnionVersion::Builder::isB((Builder *)local_160);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (bVar1) {
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)&_kjCondition_1.result,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x532,FAILED,"root.isB()","_kjCondition,",
             (DebugExpression<bool> *)((long)&f.exception + 7));
  local_1a0 = 0x7b;
  local_19c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a0);
  uStack_1a8 = capnproto_test::capnp::test::TestNewUnionVersion::Builder::getB((Builder *)local_160)
  ;
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_198,&local_19c,&stack0xfffffffffffffe58);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_198);
  if (!bVar1) {
    local_1a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a9 != false) {
      local_1b0 = 0x7b;
      local_1b8 = capnproto_test::capnp::test::TestNewUnionVersion::Builder::getB
                            ((Builder *)local_160);
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x533,ERROR,
                 "\"failed: expected \" \"(123) == (root.getB())\", _kjCondition, 123, root.getB()",
                 (char (*) [40])"failed: expected (123) == (root.getB())",
                 (DebugComparison<int,_unsigned_long> *)local_198,&local_1b0,&local_1b8);
      local_1a9 = false;
    }
  }
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1.result);
}

Assistant:

TEST(Encoding, UpgradeUnion) {
  // This tests for a specific case that was broken originally.
  MallocMessageBuilder builder;

  {
    auto root = builder.getRoot<test::TestOldUnionVersion>();
    root.setB(123);
  }

  {
    auto root = builder.getRoot<test::TestNewUnionVersion>();
    ASSERT_TRUE(root.isB())
    EXPECT_EQ(123, root.getB());
  }
}